

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O2

void __thiscall sc_core::sc_clock::report_error(sc_clock *this,char *id,char *add_msg)

{
  ostream *poVar1;
  char *local_1c0;
  stringstream msg;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  if (add_msg != (char *)0x0) {
    poVar1 = std::operator<<(local_190,add_msg);
    std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<(local_190,"clock \'");
  poVar1 = std::operator<<(poVar1,(this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
                                  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.
                                  super_sc_signal_channel.super_sc_prim_channel.super_sc_object.
                                  m_name._M_dataplus._M_p);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_ERROR,id,local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/communication/sc_clock.cpp"
             ,0x124);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  return;
}

Assistant:

void
sc_clock::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if( add_msg != 0 )
      msg << add_msg << ": ";
    msg << "clock '" << name() << "'";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}